

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O3

int CreateScratchFunc(VMFunctionBuilder *buildit,int value1,int value2)

{
  int iVar1;
  
  VMFunctionBuilder::EmitParamInt(buildit,value1);
  if (value2 == 0) {
    iVar1 = 1;
  }
  else {
    VMFunctionBuilder::EmitParamInt(buildit,SoundMap.Array[(long)value2 + -1].ID);
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

static int CreateScratchFunc(VMFunctionBuilder &buildit, int value1, int value2)
{ // A_CustomMeleeAttack
	buildit.EmitParamInt(value1);					// damage
	if (value2)
	{
		buildit.EmitParamInt(SoundMap[value2-1]);	// hit sound
		return 2;
	}
	return 1;
}